

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  CType *ct;
  char cVar2;
  CTState *cts;
  ulong uVar3;
  TRef *pTVar4;
  ushort uVar5;
  ushort uVar6;
  uint tr;
  IRType IVar7;
  CTypeID CVar8;
  TRef TVar9;
  CTSize sz;
  TRef TVar10;
  int iVar11;
  GCcdata *cd;
  CType *pCVar12;
  cTValue *pcVar13;
  uint uVar14;
  uint64_t u64;
  uint uVar15;
  CType *pCVar16;
  uint k;
  IRRef1 IVar17;
  GCobj *o;
  bool bVar18;
  ptrdiff_t ofs;
  CTSize fofs;
  TRef local_7c;
  uint64_t local_40;
  uint local_34;
  
  local_7c = *J->base;
  local_40 = 0x10;
  cd = argv2cdata(J,local_7c,rd->argv);
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  pCVar12 = cts->tab;
  pCVar16 = pCVar12 + cd->ctypeid;
  if ((pCVar12[cd->ctypeid].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar16->size;
    if ((~pCVar12[cd->ctypeid].info & 0x20800000) == 0) {
      pCVar16 = pCVar12 + (ushort)pCVar16->info;
    }
    (J->fold).ins.field_0.ot = (ushort)(*pCVar1 == 8) * 4 + 0x4505;
    (J->fold).ins.field_0.op1 = (IRRef1)local_7c;
    (J->fold).ins.field_0.op2 = 0x17;
    TVar9 = lj_opt_fold(J);
    local_40 = 0;
    local_7c = crec_reassoc_ofs(J,TVar9,(ptrdiff_t *)&local_40,1);
  }
  do {
    tr = J->base[1];
    pCVar12 = pCVar16;
    if ((tr >> 0x18 & 0x1e) - 0xe < 6) {
      tr = lj_opt_narrow_cindex(J,tr);
      CVar8 = 0;
      if ((pCVar16->info & 0xe0000000) == 0x20000000) {
LAB_00133dc4:
        if ((pCVar16->info & 0x4000000) != 0) {
          TVar9 = lj_ir_kint64(J,1);
          (J->fold).ins.field_0.ot = 0x2115;
          (J->fold).ins.field_0.op1 = (IRRef1)tr;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          tr = lj_opt_fold(J);
        }
        uVar5 = (ushort)pCVar16->info;
        CVar8 = (CTypeID)uVar5;
        sz = lj_ctype_size(cts,(uint)uVar5);
        TVar9 = crec_reassoc_ofs(J,tr,(ptrdiff_t *)&local_40,sz);
        TVar10 = lj_ir_kint64(J,(ulong)sz);
        (J->fold).ins.field_0.ot = 0x2b15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
        tr = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)tr;
        (J->fold).ins.field_0.op2 = (IRRef1)local_7c;
        local_7c = lj_opt_fold(J);
      }
    }
    else {
      IVar17 = (IRRef1)tr;
      if ((tr & 0x1f000000) == 0x4000000) {
        o = (GCobj *)(rd->argv[1].u64 & 0x7fffffffffff);
        if ((cd != (GCcdata *)0x0) && (cd->ctypeid == 0x16)) {
          CVar8 = crec_constructor(J,cd,local_7c);
          pCVar16 = cts->tab + CVar8;
        }
        if ((pCVar16->info & 0xf0000000) == 0x10000000) {
          pCVar12 = lj_ctype_getfieldq(cts,pCVar16,&o->str,&local_34,(CTInfo *)0x0);
          bVar18 = true;
          if (pCVar12 == (CType *)0x0) {
            CVar8 = 0;
          }
          else {
            u64 = local_34 + local_40;
            local_40 = u64;
            TVar9 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar17;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            lj_opt_fold(J);
            uVar15 = pCVar12->info;
            if (uVar15 >> 0x1c == 10) {
              if (u64 != 0) {
                TVar9 = lj_ir_kint64(J,u64);
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)local_7c;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                local_7c = lj_opt_fold(J);
              }
              uVar15 = pCVar12->info;
              uVar14 = uVar15 >> 0x10 & 0x7f;
              iVar11 = 0x1f;
              if (uVar14 != 0) {
                for (; uVar14 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                }
              }
              uVar5 = ((ushort)iVar11 ^ 0x1f) * 2 ^ 0x3e;
              uVar6 = (ushort)(uVar15 >> 0x10) & 0x80;
              (J->fold).ins.field_0.ot = (uVar6 >> 7) + uVar5 + 0x460f;
              (J->fold).ins.field_0.op1 = (IRRef1)local_7c;
              (J->fold).ins.field_0.op2 = 0;
              TVar9 = lj_opt_fold(J);
              k = uVar15 & 0x7f;
              uVar14 = uVar15 >> 8 & 0x7f;
              IVar17 = (IRRef1)TVar9;
              if (rd->data == 0) {
                if ((uVar15 >> 0x1b & 1) == 0) {
                  if ((uVar15 & 0x800000) == 0) {
                    iVar11 = 0x20 - uVar14;
                    TVar9 = lj_ir_kint(J,iVar11 - k);
                    (J->fold).ins.field_0.ot = 0x2413;
                    (J->fold).ins.field_0.op1 = IVar17;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                    TVar9 = lj_opt_fold(J);
                    TVar10 = lj_ir_kint(J,iVar11);
                    IVar17 = (IRRef1)TVar10;
                    (J->fold).ins.field_0.ot = 0x2613;
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                  }
                  else {
                    TVar9 = lj_ir_kint(J,k);
                    (J->fold).ins.field_0.ot = 0x2513;
                    (J->fold).ins.field_0.op1 = IVar17;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                    TVar9 = lj_opt_fold(J);
                    TVar10 = lj_ir_kint(J,~(-1 << ((byte)(uVar15 >> 8) & 0x1f)));
                    IVar17 = (IRRef1)TVar10;
                    (J->fold).ins.field_0.ot = 0x2113;
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                  }
                  (J->fold).ins.field_0.op2 = IVar17;
                  TVar9 = lj_opt_fold(J);
                }
                else {
                  TVar9 = lj_ir_kint(J,1 << ((byte)k & 0x1f));
                  (J->fold).ins.field_0.ot = 0x2113;
                  (J->fold).ins.field_0.op1 = IVar17;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                  TVar9 = lj_opt_fold(J);
                  TVar10 = lj_ir_kint(J,0);
                  (J->fold).ins.field_0.ot = 0x993;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
                  J->postproc = LJ_POST_FIXGUARD;
                  TVar9 = 0x2007ffd;
                }
                *J->base = TVar9;
                bVar18 = false;
              }
              else {
                iVar11 = 10 - (uint)((uVar15 & 0x800000) == 0);
                if ((uVar15 >> 0x1b & 1) != 0) {
                  iVar11 = 3;
                }
                uVar5 = (uVar6 >> 7) + uVar5 + 0xf;
                uVar15 = ~(-1 << ((byte)uVar14 & 0x1f)) << ((byte)k & 0x1f);
                TVar9 = crec_ct_tv(J,(CType *)((ulong)(uint)(iVar11 * 0x18) +
                                              **(long **)&J[-1].penalty[0x3c].val),0,J->base[2],
                                   rd->argv + 2);
                TVar10 = lj_ir_kint(J,k);
                (J->fold).ins.field_0.ot = 0x2413;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
                TVar9 = lj_opt_fold(J);
                TVar10 = lj_ir_kint(J,uVar15);
                (J->fold).ins.field_0.ot = uVar5 | 0x2100;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
                TVar9 = lj_opt_fold(J);
                TVar10 = lj_ir_kint(J,~uVar15);
                (J->fold).ins.field_0.ot = uVar5 | 0x2100;
                (J->fold).ins.field_0.op1 = IVar17;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
                TVar10 = lj_opt_fold(J);
                (J->fold).ins.field_0.ot = uVar5 | 0x2200;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                TVar9 = lj_opt_fold(J);
                (J->fold).ins.field_0.ot = uVar5 | 0x4e00;
                (J->fold).ins.field_0.op1 = (IRRef1)local_7c;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                lj_opt_fold(J);
                rd->nres = 0;
                J->needsnap = '\x01';
                bVar18 = false;
              }
              goto LAB_0013428f;
            }
            if (uVar15 >> 0x1c == 0xb) {
              uVar14 = pCVar12->size;
              if (((int)uVar14 < 0) && ((cts->tab[uVar15 & 0xffff].info & 0x800000) != 0)) {
                TVar9 = lj_ir_knum_u64(J,(uint64_t)(double)uVar14);
              }
              else {
                TVar9 = lj_ir_kint(J,uVar14);
              }
              *J->base = TVar9;
              CVar8 = 0;
              bVar18 = false;
            }
            else {
              CVar8 = uVar15 & 0xffff;
LAB_00133ed4:
              bVar18 = true;
            }
          }
        }
        else {
          bVar18 = true;
          if (((pCVar16->info & 0xf4000000) == 0x34000000) && ((o->str).len == 2)) {
            cVar2 = (char)(o->gch).gclist.gcptr64;
            if (cVar2 == 'i') {
              if (*(char *)((long)&(o->gch).gclist.gcptr64 + 1) == 'm') goto LAB_00133c9c;
            }
            else if ((cVar2 == 'r') && (*(char *)((long)&(o->gch).gclist.gcptr64 + 1) == 'e')) {
LAB_00133c9c:
              TVar9 = lj_ir_kgc(J,o,IRT_STR);
              (J->fold).ins.field_0.ot = 0x884;
              (J->fold).ins.field_0.op1 = IVar17;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
              lj_opt_fold(J);
              if ((char)(o->gch).gclist.gcptr64 == 'i') {
                local_40 = local_40 + (pCVar16->size >> 1);
              }
              CVar8 = (CTypeID)(ushort)pCVar16->info;
              goto LAB_00133ed4;
            }
          }
LAB_0013428f:
          CVar8 = 0;
        }
        pCVar12 = pCVar16;
        if (!bVar18) {
          return;
        }
      }
      else {
        CVar8 = 0;
        if ((tr & 0x1f000000) == 0xa000000) {
          ct = cts->tab + *(ushort *)((rd->argv[1].u64 & 0x7fffffffffff) + 10);
          IVar7 = crec_ct2irt(cts,ct);
          bVar18 = (pCVar16->info & 0xe0000000) == 0x20000000;
          if (IRT_NUM < IVar7 && bVar18) {
            uVar5 = (ushort)IVar7;
            if (ct->size == 4) {
              (J->fold).ins.field_0.ot = uVar5 | 0x4500;
              (J->fold).ins.field_0.op1 = IVar17;
              (J->fold).ins.field_0.op2 = 0x18;
            }
            else if (ct->size == 8) {
              (J->fold).ins.field_0.ot = uVar5 | 0x4500;
              (J->fold).ins.field_0.op1 = IVar17;
              (J->fold).ins.field_0.op2 = 0x19;
            }
            else {
              TVar9 = lj_ir_kint64(J,0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = IVar17;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
              TVar9 = lj_opt_fold(J);
              (J->fold).ins.field_0.ot = uVar5 | 0x4600;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
              (J->fold).ins.field_0.op2 = 0;
            }
            tr = lj_opt_fold(J);
            if ((ct->size < 8) && ((ct->info & 0x800000) == 0)) {
              (J->fold).ins.field_0.op1 = (IRRef1)tr;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b150ab3;
              tr = lj_opt_fold(J);
            }
          }
          CVar8 = 0;
          if (IRT_NUM < IVar7 && bVar18) goto LAB_00133dc4;
        }
      }
    }
    if (CVar8 != 0) {
      if (local_40 != 0) {
        TVar9 = lj_ir_kint64(J,local_40);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)local_7c;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        local_7c = lj_opt_fold(J);
      }
      pCVar16 = cts->tab + CVar8;
      if ((pCVar16->info & 0xf0800000) == 0x20800000) {
        (J->fold).ins.field_0.op1 = (IRRef1)local_7c;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x46090000;
        local_7c = lj_opt_fold(J);
        uVar5 = (ushort)pCVar16->info;
        CVar8 = (CTypeID)uVar5;
        pCVar16 = (CType *)((long)&cts->tab->info + (ulong)((uint)uVar5 * 0x18));
      }
      if (rd->data != 0) {
        rd->nres = 0;
        J->needsnap = '\x01';
        crec_ct_tv(J,pCVar16,local_7c,J->base[2],rd->argv + 2);
        return;
      }
      TVar9 = crec_tv_ct(J,pCVar16,CVar8,local_7c);
      *J->base = TVar9;
      return;
    }
    if ((((pCVar12->info & 0xf0000000) != 0x20000000) ||
        (pCVar16 = cts->tab + (ushort)pCVar12->info, (pCVar16->info & 0xf0000000) != 0x10000000)) ||
       (cd = (GCcdata *)0x0, pCVar12 = pCVar16, (tr & 0x1f000000) != 0x4000000)) {
      pcVar13 = lj_ctype_meta(cts,(int)((ulong)((long)pCVar12 - (long)cts->tab) >> 3) * -0x55555555,
                              (uint)(rd->data != 0));
      if (pcVar13 != (cTValue *)0x0) {
        uVar3 = pcVar13->u64;
        if ((long)uVar3 >> 0x2f == -9) {
          TVar9 = lj_ir_kgc(J,(GCobj *)(uVar3 & 0x7fffffffffff),IRT_FUNC);
          pTVar4 = J->base;
          pTVar4[-2] = TVar9;
          pTVar4[-1] = 0x10000;
          rd->nres = -1;
          return;
        }
        if ((((long)uVar3 >> 0x2f == -0xc) && (rd->data == 0)) &&
           ((J->base[1] & 0x1f000000) == 0x4000000)) {
          pcVar13 = lj_tab_get(J->L,(GCtab *)(uVar3 & 0x7fffffffffff),rd->argv + 1);
          TVar9 = lj_record_constify(J,pcVar13);
          pTVar4 = J->base;
          *pTVar4 = TVar9;
          if (TVar9 != 0) {
            TVar9 = pTVar4[1];
            TVar10 = lj_ir_kgc(J,(GCobj *)(rd->argv[1].u64 & 0x7fffffffffff),IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
            lj_opt_fold(J);
            return;
          }
        }
      }
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}